

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoquad.cpp
# Opt level: O3

void pzgeom::TPZGeoQuad::InsertExampleElement
               (TPZGeoMesh *gmesh,int matid,TPZVec<double> *lowercorner,TPZVec<double> *size)

{
  TPZAdmChunkVector<TPZGeoNode,_10> *this;
  ulong uVar1;
  double *pdVar2;
  double *pdVar3;
  int iVar4;
  TPZGeoNode *pTVar5;
  ulong uVar6;
  long lVar7;
  TPZManVector<long,_4> nodeindexes;
  int64_t index;
  TPZManVector<double,_3> local_b0;
  TPZVec<long> local_78;
  long local_58 [4];
  undefined1 local_38 [8];
  
  TPZVec<long>::TPZVec(&local_78,0);
  local_78._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01878bc8;
  local_78.fStore = local_58;
  local_78.fNElements = 4;
  local_78.fNAlloc = 0;
  local_b0.super_TPZVec<double>.fNAlloc = 0;
  local_b0.super_TPZVec<double>.fStore = (double *)0x0;
  local_b0.super_TPZVec<double>.fNElements = 0;
  local_b0.super_TPZVec<double>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01819f98;
  uVar1 = lowercorner->fNElements;
  if ((long)uVar1 < 4) {
    local_b0.super_TPZVec<double>.fStore = local_b0.fExtAlloc;
    if ((long)uVar1 < 1) goto LAB_00e5c630;
  }
  else {
    local_b0.super_TPZVec<double>.fStore =
         (double *)operator_new__(-(ulong)(uVar1 >> 0x3d != 0) | uVar1 * 8);
    local_b0.super_TPZVec<double>.fNAlloc = uVar1;
  }
  pdVar2 = lowercorner->fStore;
  uVar6 = 0;
  do {
    local_b0.super_TPZVec<double>.fStore[uVar6] = pdVar2[uVar6];
    uVar6 = uVar6 + 1;
  } while (uVar1 != uVar6);
LAB_00e5c630:
  pdVar2 = size->fStore;
  lVar7 = 0;
  do {
    local_b0.super_TPZVec<double>.fStore[lVar7] =
         pdVar2[lVar7] * 0.2 + local_b0.super_TPZVec<double>.fStore[lVar7];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  this = &gmesh->fNodeVec;
  local_b0.super_TPZVec<double>.fNElements = uVar1;
  iVar4 = TPZAdmChunkVector<TPZGeoNode,_10>::AllocateNewElement(this);
  *local_78.fStore = (long)iVar4;
  pTVar5 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                     (&this->super_TPZChunkVector<TPZGeoNode,_10>,(long)iVar4);
  TPZGeoNode::Initialize(pTVar5,&local_b0.super_TPZVec<double>,gmesh);
  *local_b0.super_TPZVec<double>.fStore =
       *size->fStore * 0.6 + *local_b0.super_TPZVec<double>.fStore;
  iVar4 = TPZAdmChunkVector<TPZGeoNode,_10>::AllocateNewElement(this);
  local_78.fStore[1] = (long)iVar4;
  pTVar5 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                     (&this->super_TPZChunkVector<TPZGeoNode,_10>,(long)iVar4);
  TPZGeoNode::Initialize(pTVar5,&local_b0.super_TPZVec<double>,gmesh);
  pdVar2 = size->fStore;
  local_b0.super_TPZVec<double>.fStore[1] = *pdVar2 * 0.6 + local_b0.super_TPZVec<double>.fStore[1];
  *local_b0.super_TPZVec<double>.fStore = *pdVar2 * 0.1 + *local_b0.super_TPZVec<double>.fStore;
  local_b0.super_TPZVec<double>.fStore[2] = *pdVar2 * 0.3 + local_b0.super_TPZVec<double>.fStore[2];
  iVar4 = TPZAdmChunkVector<TPZGeoNode,_10>::AllocateNewElement(this);
  local_78.fStore[2] = (long)iVar4;
  pTVar5 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                     (&this->super_TPZChunkVector<TPZGeoNode,_10>,(long)iVar4);
  TPZGeoNode::Initialize(pTVar5,&local_b0.super_TPZVec<double>,gmesh);
  pdVar2 = lowercorner->fStore;
  pdVar3 = size->fStore;
  lVar7 = 0;
  do {
    local_b0.super_TPZVec<double>.fStore[lVar7] = pdVar3[lVar7] * 0.2 + pdVar2[lVar7];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  local_b0.super_TPZVec<double>.fStore[1] =
       pdVar3[1] * 0.4 + local_b0.super_TPZVec<double>.fStore[1];
  local_b0.super_TPZVec<double>.fStore[2] =
       pdVar3[2] * -0.2 + local_b0.super_TPZVec<double>.fStore[2];
  iVar4 = TPZAdmChunkVector<TPZGeoNode,_10>::AllocateNewElement(this);
  local_78.fStore[3] = (long)iVar4;
  pTVar5 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                     (&this->super_TPZChunkVector<TPZGeoNode,_10>,(long)iVar4);
  TPZGeoNode::Initialize(pTVar5,&local_b0.super_TPZVec<double>,gmesh);
  (*(gmesh->super_TPZSavable)._vptr_TPZSavable[0xc])
            (gmesh,3,&local_78,(ulong)(uint)matid,local_38,1);
  TPZManVector<double,_3>::~TPZManVector(&local_b0);
  if (local_78.fStore != local_58) {
    local_78.fNAlloc = 0;
    local_78._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
    if (local_78.fStore != (long *)0x0) {
      operator_delete__(local_78.fStore);
    }
  }
  return;
}

Assistant:

void TPZGeoQuad::InsertExampleElement(TPZGeoMesh &gmesh, int matid, TPZVec<REAL> &lowercorner, TPZVec<REAL> &size)
    {
        TPZManVector<int64_t,4> nodeindexes(4);
        TPZManVector<REAL,3> co(lowercorner);
        for (int i=0; i<3; i++) {
            co[i] += 0.2*size[i];
        }

        nodeindexes[0] = gmesh.NodeVec().AllocateNewElement();
        gmesh.NodeVec()[nodeindexes[0]].Initialize(co, gmesh);
        co[0] += 0.6 * size[0];
        nodeindexes[1] = gmesh.NodeVec().AllocateNewElement();
        gmesh.NodeVec()[nodeindexes[1]].Initialize(co, gmesh);
        co[1] += 0.6 * size[0];
        co[0] += 0.1 * size[0];
        co[2] += 0.3 * size[0];
        nodeindexes[2] = gmesh.NodeVec().AllocateNewElement();
        gmesh.NodeVec()[nodeindexes[2]].Initialize(co, gmesh);
        for (int i = 0; i < 3; i++) co[i] = lowercorner[i] + 0.2 * size[i];
        co[1] += 0.4 * size[1];
        co[2] -= 0.2 * size[2];
        nodeindexes[3] = gmesh.NodeVec().AllocateNewElement();
        gmesh.NodeVec()[nodeindexes[3]].Initialize(co, gmesh);
        int64_t index;
        gmesh.CreateGeoElement(EQuadrilateral, nodeindexes, matid, index);
    }